

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O2

shared_ptr<(anonymous_namespace)::schema> __thiscall
anon_unknown.dwarf_4db70::schema_ref::make_for_default_
          (schema_ref *this,shared_ptr<(anonymous_namespace)::schema> *sch,root_schema *root,
          vector<nlohmann::json_uri,_std::allocator<nlohmann::json_uri>_> *uris,json *default_value)

{
  root_schema *prVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  json *in_R9;
  _Manager_type *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  shared_ptr<(anonymous_namespace)::schema> sVar2;
  __allocator_type __a2;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::schema_ref,_std::allocator<(anonymous_namespace)::schema_ref>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_70;
  _Manager_type *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  string local_50;
  
  nlohmann::json_uri::to_string_abi_cxx11_(&local_50,*(json_uri **)default_value);
  prVar1 = (root_schema *)operator_new(0x70);
  local_70._M_alloc = &__a2;
  *(undefined8 *)((long)&(prVar1->loader_).super__Function_base._M_functor + 8) = 0x100000001;
  *(undefined ***)&(prVar1->loader_).super__Function_base._M_functor =
       &PTR___Sp_counted_ptr_inplace_00154118;
  this_00 = &(prVar1->loader_).super__Function_base._M_manager;
  local_70._M_ptr = (pointer)prVar1;
  schema_ref((schema_ref *)this_00,&local_50,(root_schema *)uris);
  local_70._M_ptr = (pointer)0x0;
  local_60 = this_00;
  local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)prVar1;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::schema_ref,_std::allocator<(anonymous_namespace)::schema_ref>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_70);
  std::__cxx11::string::~string((string *)&local_50);
  set_target((schema_ref *)this_00,(shared_ptr<(anonymous_namespace)::schema> *)root,true);
  schema::set_default_value((schema *)this_00,in_R9);
  (this->super_schema)._vptr_schema = (_func_int **)this_00;
  local_58._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_schema).root_ = prVar1;
  local_60 = (_Manager_type *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58);
  sVar2.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  sVar2.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       &this->super_schema;
  return (shared_ptr<(anonymous_namespace)::schema>)
         sVar2.super___shared_ptr<(anonymous_namespace)::schema,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

virtual std::shared_ptr<schema> make_for_default_(
	    std::shared_ptr<::schema> &sch,
	    root_schema *root,
	    std::vector<nlohmann::json_uri> &uris,
	    nlohmann::json &default_value) const override
	{
		// create a new reference schema using the original reference (which will be resolved later)
		// to store this overloaded default value #209
		auto result = std::make_shared<schema_ref>(uris[0].to_string(), root);
		result->set_target(sch, true);
		result->set_default_value(default_value);
		return result;
	}